

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

void __thiscall
QDockAreaLayout::getGrid
          (QDockAreaLayout *this,QList<QLayoutStruct> *_ver_struct_list,
          QList<QLayoutStruct> *_hor_struct_list)

{
  QDockAreaLayoutInfo *this_00;
  QDockAreaLayoutInfo *this_01;
  QDockAreaLayoutInfo *this_02;
  QDockAreaLayoutInfo *this_03;
  int iVar1;
  int iVar2;
  ulong uVar3;
  QSize QVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint extraout_var;
  uint extraout_var_00;
  int extraout_var_01;
  QSize QVar14;
  QSize QVar15;
  QSize QVar16;
  QSize QVar17;
  QSize QVar18;
  QSize QVar19;
  QSize QVar20;
  QSize QVar21;
  QSize QVar22;
  QSize QVar23;
  pointer pQVar24;
  pointer pQVar25;
  uint uVar26;
  Representation RVar27;
  Representation RVar28;
  Representation RVar29;
  Representation RVar30;
  ulong uVar31;
  long lVar32;
  Representation RVar33;
  Representation RVar34;
  int iVar35;
  Representation RVar36;
  Representation RVar37;
  Representation RVar38;
  uint uVar39;
  uint uVar40;
  Representation RVar41;
  QSize QVar42;
  QList<QLayoutStruct> *ver_struct_list;
  QList<QLayoutStruct> *hor_struct_list;
  byte local_128;
  bool local_124;
  int local_104;
  int local_100;
  int local_fc;
  
  if (this->centralWidgetItem == (QLayoutItem *)0x0) {
    local_124 = false;
    local_128 = 0;
    iVar13 = 0;
    iVar35 = 0;
    uVar12 = 0;
    uVar40 = 0;
    uVar11 = 0;
    uVar26 = 0;
  }
  else {
    iVar10 = (*this->centralWidgetItem->_vptr_QLayoutItem[8])();
    local_124 = false;
    local_128 = 0;
    iVar13 = 0;
    iVar35 = 0;
    uVar12 = 0;
    uVar40 = 0;
    uVar11 = 0;
    uVar26 = 0;
    if ((char)iVar10 == '\0') {
      uVar11 = ((this->centralWidgetRect).x2.m_i - (this->centralWidgetRect).x1.m_i) + 1;
      uVar26 = ((this->centralWidgetRect).y2.m_i - (this->centralWidgetRect).y1.m_i) + 1;
      if ((int)(uVar11 | uVar26) < 0) {
        uVar11 = (*this->centralWidgetItem->_vptr_QLayoutItem[2])();
        uVar26 = extraout_var;
      }
      uVar12 = (*this->centralWidgetItem->_vptr_QLayoutItem[3])();
      iVar13 = (*this->centralWidgetItem->_vptr_QLayoutItem[4])();
      local_124 = true;
      local_128 = 1;
      uVar40 = extraout_var_00;
      iVar35 = extraout_var_01;
    }
  }
  iVar10 = (this->rect).x1.m_i;
  local_104 = (this->rect).y1.m_i;
  local_fc = (this->rect).x2.m_i;
  local_100 = (this->rect).y2.m_i;
  this_00 = this->docks;
  uVar31 = 0xffffffffffffffff;
  lVar32 = 0;
  do {
    uVar31 = uVar31 + 1;
    if ((ulong)this->docks[0].item_list.d.size <= uVar31) goto LAB_003f6f08;
    bVar5 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       ((long)&(this->docks[0].item_list.d.ptr)->widgetItem + lVar32));
    lVar32 = lVar32 + 0x28;
  } while (bVar5);
  iVar10 = (((this->rect).x1.m_i + this->docks[0].rect.x2.m_i) - this->docks[0].rect.x1.m_i) +
           this->sep + 1;
LAB_003f6f08:
  this_01 = this->docks + 2;
  uVar31 = 0xffffffffffffffff;
  lVar32 = 0;
  do {
    uVar31 = uVar31 + 1;
    if ((ulong)this->docks[2].item_list.d.size <= uVar31) goto LAB_003f6f65;
    bVar5 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       ((long)&(this->docks[2].item_list.d.ptr)->widgetItem + lVar32));
    lVar32 = lVar32 + 0x28;
  } while (bVar5);
  local_104 = (((this->rect).y1.m_i + this->docks[2].rect.y2.m_i) - this->docks[2].rect.y1.m_i) +
              this->sep + 1;
LAB_003f6f65:
  this_02 = this->docks + 1;
  uVar31 = 0xffffffffffffffff;
  lVar32 = 0;
  do {
    uVar31 = uVar31 + 1;
    if ((ulong)this->docks[1].item_list.d.size <= uVar31) goto LAB_003f6fb7;
    bVar5 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       ((long)&(this->docks[1].item_list.d.ptr)->widgetItem + lVar32));
    lVar32 = lVar32 + 0x28;
  } while (bVar5);
  local_fc = (~this->docks[1].rect.x2.m_i + (this->rect).x2.m_i + this->docks[1].rect.x1.m_i) -
             this->sep;
LAB_003f6fb7:
  this_03 = this->docks + 3;
  uVar31 = 0xffffffffffffffff;
  lVar32 = 0;
  do {
    uVar31 = uVar31 + 1;
    if ((ulong)this->docks[3].item_list.d.size <= uVar31) goto LAB_003f7009;
    bVar5 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       ((long)&(this->docks[3].item_list.d.ptr)->widgetItem + lVar32));
    lVar32 = lVar32 + 0x28;
  } while (bVar5);
  local_100 = (~this->docks[3].rect.y2.m_i + (this->rect).y2.m_i + this->docks[3].rect.y1.m_i) -
              this->sep;
LAB_003f7009:
  QVar14 = QDockAreaLayoutInfo::size(this_00);
  if (((ulong)QVar14 >> 0x20 == 0 && QVar14.wd.m_i.m_i == 0) || (this->fallbackToSizeHints == true))
  {
    QVar14 = QDockAreaLayoutInfo::sizeHint(this_00);
  }
  QVar15 = QDockAreaLayoutInfo::minimumSize(this_00);
  RVar41 = QVar15.ht.m_i;
  QVar16 = QDockAreaLayoutInfo::maximumSize(this_00);
  QVar4 = QVar14;
  if (QVar16.wd.m_i.m_i <= QVar14.wd.m_i.m_i) {
    QVar4 = QVar16;
  }
  RVar27.m_i = QVar16.ht.m_i.m_i;
  if (QVar14.ht.m_i.m_i < QVar16.ht.m_i.m_i) {
    RVar27.m_i = QVar14.ht.m_i.m_i;
  }
  if (QVar4.wd.m_i.m_i <= QVar15.wd.m_i.m_i) {
    QVar4 = QVar15;
  }
  if (RVar27.m_i <= RVar41.m_i) {
    RVar27.m_i = RVar41.m_i;
  }
  QVar14 = QDockAreaLayoutInfo::size(this_02);
  if (((ulong)QVar14 >> 0x20 == 0 && QVar14.wd.m_i.m_i == 0) ||
     (QVar17 = QVar14, this->fallbackToSizeHints == true)) {
    QVar17 = QDockAreaLayoutInfo::sizeHint(this_02);
    QVar14 = (QSize)((ulong)QVar17 & 0xffffffff);
  }
  QVar18 = QDockAreaLayoutInfo::minimumSize(this_02);
  RVar34 = QVar18.ht.m_i;
  QVar19 = QDockAreaLayoutInfo::maximumSize(this_02);
  if (QVar19.wd.m_i.m_i <= QVar14.wd.m_i.m_i) {
    QVar14 = QVar19;
  }
  RVar28.m_i = QVar19.ht.m_i.m_i;
  if (QVar17.ht.m_i.m_i < QVar19.ht.m_i.m_i) {
    RVar28.m_i = QVar17.ht.m_i.m_i;
  }
  if (QVar14.wd.m_i.m_i <= QVar18.wd.m_i.m_i) {
    QVar14 = QVar18;
  }
  if (RVar28.m_i <= RVar34.m_i) {
    RVar28.m_i = RVar34.m_i;
  }
  QVar17 = QDockAreaLayoutInfo::size(this_01);
  if (((ulong)QVar17 >> 0x20 == 0 && QVar17.wd.m_i.m_i == 0) ||
     (QVar42 = QVar17, this->fallbackToSizeHints == true)) {
    QVar17 = QDockAreaLayoutInfo::sizeHint(this_01);
    QVar42 = (QSize)((ulong)QVar17 & 0xffffffff);
  }
  QVar20 = QDockAreaLayoutInfo::minimumSize(this_01);
  RVar36 = QVar20.ht.m_i;
  QVar21 = QDockAreaLayoutInfo::maximumSize(this_01);
  if (QVar21.wd.m_i.m_i <= QVar42.wd.m_i.m_i) {
    QVar42 = QVar21;
  }
  RVar29 = QVar21.ht.m_i;
  RVar38.m_i = QVar17.ht.m_i.m_i;
  if (RVar29.m_i <= QVar17.ht.m_i.m_i) {
    RVar38.m_i = RVar29.m_i;
  }
  if (QVar42.wd.m_i.m_i <= QVar20.wd.m_i.m_i) {
    QVar42 = QVar20;
  }
  if (RVar38.m_i <= RVar36.m_i) {
    RVar38.m_i = RVar36.m_i;
  }
  QVar17 = QDockAreaLayoutInfo::size(this_03);
  if (((ulong)QVar17 >> 0x20 == 0 && QVar17.wd.m_i.m_i == 0) || (this->fallbackToSizeHints == true))
  {
    QVar17 = QDockAreaLayoutInfo::sizeHint(this_03);
  }
  QVar22 = QDockAreaLayoutInfo::minimumSize(this_03);
  RVar33 = QVar22.ht.m_i;
  QVar23 = QDockAreaLayoutInfo::maximumSize(this_03);
  QVar21 = QVar17;
  if (QVar23.wd.m_i.m_i <= QVar17.wd.m_i.m_i) {
    QVar21 = QVar23;
  }
  RVar30 = QVar23.ht.m_i;
  RVar37.m_i = QVar17.ht.m_i.m_i;
  if (RVar30.m_i <= QVar17.ht.m_i.m_i) {
    RVar37.m_i = RVar30.m_i;
  }
  if (QVar21.wd.m_i.m_i <= QVar22.wd.m_i.m_i) {
    QVar21 = QVar22;
  }
  if (RVar37.m_i <= RVar33.m_i) {
    RVar37.m_i = RVar33.m_i;
  }
  if (_ver_struct_list == (QList<QLayoutStruct> *)0x0) goto LAB_003f7715;
  QList<QLayoutStruct>::resize(_ver_struct_list,3);
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24->stretch = 0;
  pQVar24->sizeHint = 0;
  pQVar24->maximumSize = 0x7ffff;
  pQVar24->minimumSize = 0;
  pQVar24->expansive = false;
  pQVar24->empty = true;
  pQVar24->spacing = 0;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24->stretch = 0;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24->sizeHint = RVar38.m_i;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24->minimumSize = RVar36.m_i;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24->maximumSize = RVar29.m_i;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24->expansive = false;
  uVar31 = 0xffffffffffffffff;
  lVar32 = 0;
  do {
    uVar31 = uVar31 + 1;
    uVar3 = this->docks[2].item_list.d.size;
    if (uVar3 <= uVar31) break;
    bVar5 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       ((long)&(this->docks[2].item_list.d.ptr)->widgetItem + lVar32));
    lVar32 = lVar32 + 0x28;
  } while (bVar5);
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24->empty = uVar3 <= uVar31;
  iVar1 = this->docks[2].rect.y1.m_i;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24->pos = iVar1;
  iVar1 = this->docks[2].rect.y2.m_i;
  iVar2 = this->docks[2].rect.y1.m_i;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24->size = (iVar1 - iVar2) + 1;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24[1].stretch = 0;
  pQVar24[1].sizeHint = 0;
  pQVar24[1].maximumSize = 0x7ffff;
  pQVar24[1].minimumSize = 0;
  pQVar24[1].expansive = false;
  pQVar24[1].empty = true;
  pQVar24[1].spacing = 0;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24[1].stretch = uVar26;
  if (this->corners[0] == TopDockWidgetArea) {
    bVar5 = false;
  }
  else {
    uVar31 = 0xffffffffffffffff;
    lVar32 = 0;
    do {
      uVar31 = uVar31 + 1;
      uVar3 = this->docks[2].item_list.d.size;
      bVar5 = uVar31 < uVar3;
      if (uVar3 <= uVar31) break;
      bVar7 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->docks[2].item_list.d.ptr)->widgetItem + lVar32));
      lVar32 = lVar32 + 0x28;
    } while (bVar7);
  }
  if (this->corners[2] == BottomDockWidgetArea) {
    bVar7 = false;
  }
  else {
    uVar31 = 0xffffffffffffffff;
    lVar32 = 0;
    do {
      uVar31 = uVar31 + 1;
      uVar3 = this->docks[3].item_list.d.size;
      bVar7 = uVar31 < uVar3;
      if (uVar3 <= uVar31) break;
      bVar8 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->docks[3].item_list.d.ptr)->widgetItem + lVar32));
      lVar32 = lVar32 + 0x28;
    } while (bVar8);
  }
  if (this->corners[1] == TopDockWidgetArea) {
    bVar8 = false;
  }
  else {
    uVar31 = 0xffffffffffffffff;
    lVar32 = 0;
    do {
      uVar31 = uVar31 + 1;
      uVar3 = this->docks[2].item_list.d.size;
      bVar8 = uVar31 < uVar3;
      if (uVar3 <= uVar31) break;
      bVar9 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->docks[2].item_list.d.ptr)->widgetItem + lVar32));
      lVar32 = lVar32 + 0x28;
    } while (bVar9);
  }
  uVar39 = 0;
  bVar9 = false;
  if (this->corners[3] != BottomDockWidgetArea) {
    uVar31 = 0xffffffffffffffff;
    lVar32 = 0;
    do {
      uVar31 = uVar31 + 1;
      uVar3 = this->docks[3].item_list.d.size;
      bVar9 = uVar31 < uVar3;
      if (uVar3 <= uVar31) break;
      bVar6 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->docks[3].item_list.d.ptr)->widgetItem + lVar32));
      lVar32 = lVar32 + 0x28;
    } while (bVar6);
  }
  if (bVar8 || bVar9) {
    RVar34.m_i = uVar39;
    RVar28.m_i = uVar39;
  }
  if (RVar28.m_i < (int)uVar26) {
    RVar28.m_i = uVar26;
  }
  if (bVar5 || bVar7) {
    RVar41.m_i = uVar39;
    RVar27.m_i = uVar39;
  }
  if (RVar27.m_i < RVar28.m_i) {
    RVar27.m_i = RVar28.m_i;
  }
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  if (RVar34.m_i < (int)uVar40) {
    RVar34.m_i = uVar40;
  }
  pQVar24[1].sizeHint = RVar27.m_i;
  if (RVar34.m_i <= RVar41.m_i) {
    RVar34.m_i = RVar41.m_i;
  }
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24[1].minimumSize = RVar34.m_i;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24[1].maximumSize = iVar35;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24[1].expansive = local_124;
  uVar31 = 0xffffffffffffffff;
  lVar32 = 0;
  do {
    uVar31 = uVar31 + 1;
    if ((ulong)this->docks[0].item_list.d.size <= uVar31) {
      if (local_128 == 0) {
        uVar31 = 0xffffffffffffffff;
        lVar32 = 0;
        goto LAB_003f7575;
      }
      break;
    }
    bVar5 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       ((long)&(this->docks[0].item_list.d.ptr)->widgetItem + lVar32));
    lVar32 = lVar32 + 0x28;
  } while (bVar5);
  bVar5 = false;
  goto LAB_003f75a6;
  while( true ) {
    bVar5 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       ((long)&(this->docks[1].item_list.d.ptr)->widgetItem + lVar32));
    lVar32 = lVar32 + 0x28;
    if (!bVar5) break;
LAB_003f7575:
    uVar31 = uVar31 + 1;
    uVar3 = this->docks[1].item_list.d.size;
    if (uVar3 <= uVar31) break;
  }
  bVar5 = uVar3 <= uVar31;
LAB_003f75a6:
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24[1].empty = bVar5;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24[1].pos = local_104;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24[1].size = (local_100 - local_104) + 1;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24[2].stretch = 0;
  pQVar24[2].sizeHint = 0;
  pQVar24[2].maximumSize = 0x7ffff;
  pQVar24[2].minimumSize = 0;
  pQVar24[2].expansive = false;
  pQVar24[2].empty = true;
  pQVar24[2].spacing = 0;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24[2].stretch = 0;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24[2].sizeHint = RVar37.m_i;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24[2].minimumSize = RVar33.m_i;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24[2].maximumSize = RVar30.m_i;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24[2].expansive = false;
  uVar31 = 0xffffffffffffffff;
  lVar32 = 0;
  do {
    uVar31 = uVar31 + 1;
    uVar3 = this->docks[3].item_list.d.size;
    if (uVar3 <= uVar31) break;
    bVar5 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       ((long)&(this->docks[3].item_list.d.ptr)->widgetItem + lVar32));
    lVar32 = lVar32 + 0x28;
  } while (bVar5);
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24[2].empty = uVar3 <= uVar31;
  iVar35 = this->docks[3].rect.y1.m_i;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24[2].pos = iVar35;
  iVar35 = this->docks[3].rect.y2.m_i;
  iVar1 = this->docks[3].rect.y1.m_i;
  pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
  pQVar24[2].size = (iVar35 - iVar1) + 1;
  lVar32 = 0;
  do {
    pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar25 = QList<QLayoutStruct>::data(_ver_struct_list);
    iVar35 = *(int *)((long)&pQVar24->sizeHint + lVar32);
    iVar1 = *(int *)((long)&pQVar25->minimumSize + lVar32);
    if (iVar1 < iVar35) {
      iVar1 = iVar35;
    }
    pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
    *(int *)((long)&pQVar24->sizeHint + lVar32) = iVar1;
    lVar32 = lVar32 + 0x20;
  } while (lVar32 != 0x60);
  if (((local_128 != 0) &&
      (pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list), pQVar24->empty == true)) &&
     (pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list), pQVar24[2].empty == true)) {
    pQVar24 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar24[1].maximumSize = 0xffffff;
  }
LAB_003f7715:
  if (_hor_struct_list != (QList<QLayoutStruct> *)0x0) {
    QList<QLayoutStruct>::resize(_hor_struct_list,3);
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24->stretch = 0;
    pQVar24->sizeHint = 0;
    pQVar24->maximumSize = 0x7ffff;
    pQVar24->minimumSize = 0;
    pQVar24->expansive = false;
    pQVar24->empty = true;
    pQVar24->spacing = 0;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24->stretch = 0;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24->sizeHint = QVar4.wd.m_i.m_i;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24->minimumSize = QVar15.wd.m_i.m_i;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24->maximumSize = QVar16.wd.m_i.m_i;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24->expansive = false;
    uVar31 = 0xffffffffffffffff;
    lVar32 = 0;
    do {
      uVar31 = uVar31 + 1;
      uVar3 = this->docks[0].item_list.d.size;
      if (uVar3 <= uVar31) break;
      bVar5 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->docks[0].item_list.d.ptr)->widgetItem + lVar32));
      lVar32 = lVar32 + 0x28;
    } while (bVar5);
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24->empty = uVar3 <= uVar31;
    iVar35 = this->docks[0].rect.x1.m_i;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24->pos = iVar35;
    iVar35 = this->docks[0].rect.x2.m_i;
    iVar1 = this->docks[0].rect.x1.m_i;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24->size = (iVar35 - iVar1) + 1;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24[1].stretch = 0;
    pQVar24[1].sizeHint = 0;
    pQVar24[1].maximumSize = 0x7ffff;
    pQVar24[1].minimumSize = 0;
    pQVar24[1].expansive = false;
    pQVar24[1].empty = true;
    pQVar24[1].spacing = 0;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24[1].stretch = uVar11;
    if (this->corners[0] == LeftDockWidgetArea) {
      bVar5 = false;
    }
    else {
      uVar31 = 0xffffffffffffffff;
      lVar32 = 0;
      do {
        uVar31 = uVar31 + 1;
        uVar3 = this->docks[0].item_list.d.size;
        bVar5 = uVar31 < uVar3;
        if (uVar3 <= uVar31) break;
        bVar7 = QDockAreaLayoutItem::skip
                          ((QDockAreaLayoutItem *)
                           ((long)&(this->docks[0].item_list.d.ptr)->widgetItem + lVar32));
        lVar32 = lVar32 + 0x28;
      } while (bVar7);
    }
    if (this->corners[1] == RightDockWidgetArea) {
      bVar7 = false;
    }
    else {
      uVar31 = 0xffffffffffffffff;
      lVar32 = 0;
      do {
        uVar31 = uVar31 + 1;
        uVar3 = this->docks[1].item_list.d.size;
        bVar7 = uVar31 < uVar3;
        if (uVar3 <= uVar31) break;
        bVar8 = QDockAreaLayoutItem::skip
                          ((QDockAreaLayoutItem *)
                           ((long)&(this->docks[1].item_list.d.ptr)->widgetItem + lVar32));
        lVar32 = lVar32 + 0x28;
      } while (bVar8);
    }
    if (this->corners[2] == LeftDockWidgetArea) {
      bVar8 = false;
    }
    else {
      uVar31 = 0xffffffffffffffff;
      lVar32 = 0;
      do {
        uVar31 = uVar31 + 1;
        uVar3 = this->docks[0].item_list.d.size;
        bVar8 = uVar31 < uVar3;
        if (uVar3 <= uVar31) break;
        bVar9 = QDockAreaLayoutItem::skip
                          ((QDockAreaLayoutItem *)
                           ((long)&(this->docks[0].item_list.d.ptr)->widgetItem + lVar32));
        lVar32 = lVar32 + 0x28;
      } while (bVar9);
    }
    uVar26 = 0;
    bVar9 = false;
    if (this->corners[3] != RightDockWidgetArea) {
      uVar31 = 0xffffffffffffffff;
      lVar32 = 0;
      do {
        uVar31 = uVar31 + 1;
        uVar3 = this->docks[1].item_list.d.size;
        bVar9 = uVar31 < uVar3;
        if (uVar3 <= uVar31) break;
        bVar6 = QDockAreaLayoutItem::skip
                          ((QDockAreaLayoutItem *)
                           ((long)&(this->docks[1].item_list.d.ptr)->widgetItem + lVar32));
        lVar32 = lVar32 + 0x28;
      } while (bVar6);
    }
    RVar41.m_i = QVar22.wd.m_i.m_i;
    RVar27.m_i = QVar21.wd.m_i.m_i;
    if (bVar8 || bVar9) {
      RVar41.m_i = uVar26;
      RVar27.m_i = uVar26;
    }
    if (RVar27.m_i < (int)uVar11) {
      RVar27.m_i = uVar11;
    }
    RVar28.m_i = QVar20.wd.m_i.m_i;
    RVar34.m_i = QVar42.wd.m_i.m_i;
    if (bVar5 || bVar7) {
      RVar28.m_i = uVar26;
      RVar34.m_i = uVar26;
    }
    if (RVar34.m_i < RVar27.m_i) {
      RVar34.m_i = RVar27.m_i;
    }
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    if (RVar41.m_i < (int)uVar12) {
      RVar41.m_i = uVar12;
    }
    pQVar24[1].sizeHint = RVar34.m_i;
    if (RVar41.m_i <= RVar28.m_i) {
      RVar41.m_i = RVar28.m_i;
    }
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24[1].minimumSize = RVar41.m_i;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24[1].maximumSize = iVar13;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24[1].expansive = local_124;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24[1].empty = (bool)(local_128 ^ 1);
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24[1].pos = iVar10;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24[1].size = (local_fc - iVar10) + 1;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24[2].stretch = 0;
    pQVar24[2].sizeHint = 0;
    pQVar24[2].maximumSize = 0x7ffff;
    pQVar24[2].minimumSize = 0;
    pQVar24[2].expansive = false;
    pQVar24[2].empty = true;
    pQVar24[2].spacing = 0;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24[2].stretch = 0;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24[2].sizeHint = QVar14.wd.m_i.m_i;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24[2].minimumSize = QVar18.wd.m_i.m_i;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24[2].maximumSize = QVar19.wd.m_i.m_i;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24[2].expansive = false;
    uVar31 = 0xffffffffffffffff;
    lVar32 = 0;
    do {
      uVar31 = uVar31 + 1;
      uVar3 = this->docks[1].item_list.d.size;
      if (uVar3 <= uVar31) break;
      bVar5 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->docks[1].item_list.d.ptr)->widgetItem + lVar32));
      lVar32 = lVar32 + 0x28;
    } while (bVar5);
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24[2].empty = uVar3 <= uVar31;
    iVar35 = this->docks[1].rect.x1.m_i;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24[2].pos = iVar35;
    iVar35 = this->docks[1].rect.x2.m_i;
    iVar13 = this->docks[1].rect.x1.m_i;
    pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar24[2].size = (iVar35 - iVar13) + 1;
    lVar32 = 0;
    do {
      pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
      pQVar25 = QList<QLayoutStruct>::data(_hor_struct_list);
      iVar35 = *(int *)((long)&pQVar24->sizeHint + lVar32);
      iVar13 = *(int *)((long)&pQVar25->minimumSize + lVar32);
      if (iVar13 < iVar35) {
        iVar13 = iVar35;
      }
      pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
      *(int *)((long)&pQVar24->sizeHint + lVar32) = iVar13;
      lVar32 = lVar32 + 0x20;
    } while (lVar32 != 0x60);
    if (((local_128 != 0) &&
        (pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list), pQVar24->empty == true)) &&
       (pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list), pQVar24[2].empty == true)) {
      pQVar24 = QList<QLayoutStruct>::data(_hor_struct_list);
      pQVar24[1].maximumSize = 0xffffff;
    }
  }
  return;
}

Assistant:

void QDockAreaLayout::getGrid(QList<QLayoutStruct> *_ver_struct_list,
                              QList<QLayoutStruct> *_hor_struct_list)
{
    QSize center_hint(0, 0);
    QSize center_min(0, 0);
    QSize center_max(0, 0);
    const bool have_central = centralWidgetItem != nullptr && !centralWidgetItem->isEmpty();
    if (have_central) {
        center_hint = centralWidgetRect.size();
        if (!center_hint.isValid())
            center_hint = centralWidgetItem->sizeHint();
        center_min = centralWidgetItem->minimumSize();
        center_max = centralWidgetItem->maximumSize();
    }

    QRect center_rect = rect;
    if (!docks[QInternal::LeftDock].isEmpty())
        center_rect.setLeft(rect.left() + docks[QInternal::LeftDock].rect.width() + sep);
    if (!docks[QInternal::TopDock].isEmpty())
        center_rect.setTop(rect.top() + docks[QInternal::TopDock].rect.height() + sep);
    if (!docks[QInternal::RightDock].isEmpty())
        center_rect.setRight(rect.right() - docks[QInternal::RightDock].rect.width() - sep);
    if (!docks[QInternal::BottomDock].isEmpty())
        center_rect.setBottom(rect.bottom() - docks[QInternal::BottomDock].rect.height() - sep);

    QSize left_hint = docks[QInternal::LeftDock].size();
    if (left_hint.isNull() || fallbackToSizeHints)
        left_hint = docks[QInternal::LeftDock].sizeHint();
    QSize left_min = docks[QInternal::LeftDock].minimumSize();
    QSize left_max = docks[QInternal::LeftDock].maximumSize();
    left_hint = left_hint.boundedTo(left_max).expandedTo(left_min);

    QSize right_hint = docks[QInternal::RightDock].size();
    if (right_hint.isNull() || fallbackToSizeHints)
        right_hint = docks[QInternal::RightDock].sizeHint();
    QSize right_min = docks[QInternal::RightDock].minimumSize();
    QSize right_max = docks[QInternal::RightDock].maximumSize();
    right_hint = right_hint.boundedTo(right_max).expandedTo(right_min);

    QSize top_hint = docks[QInternal::TopDock].size();
    if (top_hint.isNull() || fallbackToSizeHints)
        top_hint = docks[QInternal::TopDock].sizeHint();
    QSize top_min = docks[QInternal::TopDock].minimumSize();
    QSize top_max = docks[QInternal::TopDock].maximumSize();
    top_hint = top_hint.boundedTo(top_max).expandedTo(top_min);

    QSize bottom_hint = docks[QInternal::BottomDock].size();
    if (bottom_hint.isNull() || fallbackToSizeHints)
        bottom_hint = docks[QInternal::BottomDock].sizeHint();
    QSize bottom_min = docks[QInternal::BottomDock].minimumSize();
    QSize bottom_max = docks[QInternal::BottomDock].maximumSize();
    bottom_hint = bottom_hint.boundedTo(bottom_max).expandedTo(bottom_min);

    if (_ver_struct_list != nullptr) {
        QList<QLayoutStruct> &ver_struct_list = *_ver_struct_list;
        ver_struct_list.resize(3);

        // top --------------------------------------------------
        ver_struct_list[0].init();
        ver_struct_list[0].stretch = 0;
        ver_struct_list[0].sizeHint = top_hint.height();
        ver_struct_list[0].minimumSize = top_min.height();
        ver_struct_list[0].maximumSize = top_max.height();
        ver_struct_list[0].expansive = false;
        ver_struct_list[0].empty = docks[QInternal::TopDock].isEmpty();
        ver_struct_list[0].pos = docks[QInternal::TopDock].rect.top();
        ver_struct_list[0].size = docks[QInternal::TopDock].rect.height();

        // center --------------------------------------------------
        ver_struct_list[1].init();
        ver_struct_list[1].stretch = center_hint.height();

        bool tl_significant = corners[Qt::TopLeftCorner] == Qt::TopDockWidgetArea
                                    || docks[QInternal::TopDock].isEmpty();
        bool bl_significant = corners[Qt::BottomLeftCorner] == Qt::BottomDockWidgetArea
                                    || docks[QInternal::BottomDock].isEmpty();
        bool tr_significant = corners[Qt::TopRightCorner] == Qt::TopDockWidgetArea
                                    || docks[QInternal::TopDock].isEmpty();
        bool br_significant = corners[Qt::BottomRightCorner] == Qt::BottomDockWidgetArea
                                    || docks[QInternal::BottomDock].isEmpty();

        int left = (tl_significant && bl_significant) ? left_hint.height() : 0;
        int right = (tr_significant && br_significant) ? right_hint.height() : 0;
        ver_struct_list[1].sizeHint = qMax(left, center_hint.height(), right);

        left = (tl_significant && bl_significant) ? left_min.height() : 0;
        right = (tr_significant && br_significant) ? right_min.height() : 0;
        ver_struct_list[1].minimumSize = qMax(left, center_min.height(), right);
        ver_struct_list[1].maximumSize = center_max.height();
        ver_struct_list[1].expansive = have_central;
        ver_struct_list[1].empty = docks[QInternal::LeftDock].isEmpty()
                                        && !have_central
                                        && docks[QInternal::RightDock].isEmpty();
        ver_struct_list[1].pos = center_rect.top();
        ver_struct_list[1].size = center_rect.height();

        // bottom --------------------------------------------------
        ver_struct_list[2].init();
        ver_struct_list[2].stretch = 0;
        ver_struct_list[2].sizeHint = bottom_hint.height();
        ver_struct_list[2].minimumSize = bottom_min.height();
        ver_struct_list[2].maximumSize = bottom_max.height();
        ver_struct_list[2].expansive = false;
        ver_struct_list[2].empty = docks[QInternal::BottomDock].isEmpty();
        ver_struct_list[2].pos = docks[QInternal::BottomDock].rect.top();
        ver_struct_list[2].size = docks[QInternal::BottomDock].rect.height();

        for (int i = 0; i < 3; ++i) {
            ver_struct_list[i].sizeHint
                = qMax(ver_struct_list[i].sizeHint, ver_struct_list[i].minimumSize);
        }
        if (have_central && ver_struct_list[0].empty && ver_struct_list[2].empty)
            ver_struct_list[1].maximumSize = QWIDGETSIZE_MAX;
    }

    if (_hor_struct_list != nullptr) {
        QList<QLayoutStruct> &hor_struct_list = *_hor_struct_list;
        hor_struct_list.resize(3);

        // left --------------------------------------------------
        hor_struct_list[0].init();
        hor_struct_list[0].stretch = 0;
        hor_struct_list[0].sizeHint = left_hint.width();
        hor_struct_list[0].minimumSize = left_min.width();
        hor_struct_list[0].maximumSize = left_max.width();
        hor_struct_list[0].expansive = false;
        hor_struct_list[0].empty = docks[QInternal::LeftDock].isEmpty();
        hor_struct_list[0].pos = docks[QInternal::LeftDock].rect.left();
        hor_struct_list[0].size = docks[QInternal::LeftDock].rect.width();

        // center --------------------------------------------------
        hor_struct_list[1].init();
        hor_struct_list[1].stretch = center_hint.width();

        bool tl_significant = corners[Qt::TopLeftCorner] == Qt::LeftDockWidgetArea
                                    || docks[QInternal::LeftDock].isEmpty();
        bool tr_significant = corners[Qt::TopRightCorner] == Qt::RightDockWidgetArea
                                    || docks[QInternal::RightDock].isEmpty();
        bool bl_significant = corners[Qt::BottomLeftCorner] == Qt::LeftDockWidgetArea
                                    || docks[QInternal::LeftDock].isEmpty();
        bool br_significant = corners[Qt::BottomRightCorner] == Qt::RightDockWidgetArea
                                    || docks[QInternal::RightDock].isEmpty();

        int top = (tl_significant && tr_significant) ? top_hint.width() : 0;
        int bottom = (bl_significant && br_significant) ? bottom_hint.width() : 0;
        hor_struct_list[1].sizeHint = qMax(top, center_hint.width(), bottom);

        top = (tl_significant && tr_significant) ? top_min.width() : 0;
        bottom = (bl_significant && br_significant) ? bottom_min.width() : 0;
        hor_struct_list[1].minimumSize = qMax(top, center_min.width(), bottom);

        hor_struct_list[1].maximumSize = center_max.width();
        hor_struct_list[1].expansive = have_central;
        hor_struct_list[1].empty = !have_central;
        hor_struct_list[1].pos = center_rect.left();
        hor_struct_list[1].size = center_rect.width();

        // right --------------------------------------------------
        hor_struct_list[2].init();
        hor_struct_list[2].stretch = 0;
        hor_struct_list[2].sizeHint = right_hint.width();
        hor_struct_list[2].minimumSize = right_min.width();
        hor_struct_list[2].maximumSize = right_max.width();
        hor_struct_list[2].expansive = false;
        hor_struct_list[2].empty = docks[QInternal::RightDock].isEmpty();
        hor_struct_list[2].pos = docks[QInternal::RightDock].rect.left();
        hor_struct_list[2].size = docks[QInternal::RightDock].rect.width();

        for (int i = 0; i < 3; ++i) {
            hor_struct_list[i].sizeHint
                = qMax(hor_struct_list[i].sizeHint, hor_struct_list[i].minimumSize);
        }
        if (have_central && hor_struct_list[0].empty && hor_struct_list[2].empty)
            hor_struct_list[1].maximumSize = QWIDGETSIZE_MAX;

    }
}